

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

optional<pbrt::CameraWiSample> * __thiscall
pbrt::PerspectiveCamera::SampleWi
          (optional<pbrt::CameraWiSample> *__return_storage_ptr__,PerspectiveCamera *this,
          Interaction *ref,Point2f *u,SampledWavelengths *lambda)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  SampledWavelengths *lambda_00;
  type tVar4;
  Point2f PVar5;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar13 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  Point3f PVar20;
  Vector3f VVar21;
  Point3f PVar22;
  SampledSpectrum SVar23;
  Point2f pRaster;
  SampledSpectrum Wi;
  Interaction lensIntr;
  Tuple2<pbrt::Point2,_float> local_1a8;
  Vector3<float> local_1a0;
  SampledSpectrum local_190;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_180;
  Tuple3<pbrt::Vector3,_float> local_178;
  Tuple3<pbrt::Normal3,_float> local_168;
  Tuple3<pbrt::Point3,_float> local_158;
  Interaction local_148;
  CameraWiSample local_f8;
  undefined1 auVar16 [56];
  
  fVar1 = (this->super_ProjectiveCamera).lensRadius;
  PVar5 = SampleUniformDiskConcentric(u);
  auVar6._0_4_ = PVar5.super_Tuple2<pbrt::Point2,_float>.x * fVar1;
  auVar6._4_4_ = PVar5.super_Tuple2<pbrt::Point2,_float>.y * fVar1;
  auVar6._8_4_ = (float)extraout_XMM0_Qb * fVar1;
  auVar6._12_4_ = (float)((ulong)extraout_XMM0_Qb >> 0x20) * fVar1;
  local_f8.Wi.values.values._0_8_ = vmovlps_avx(auVar6);
  local_f8.Wi.values.values[2] = 0.0;
  auVar13 = (undefined1  [56])0x0;
  PVar20 = AnimatedTransform::operator()((AnimatedTransform *)this,(Point3f *)&local_f8,ref->time);
  local_158.z = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar13;
  local_f8.Wi.values.values[0] = 0.0;
  local_f8.Wi.values.values[1] = 0.0;
  local_f8.Wi.values.values[2] = 1.0;
  local_158._0_8_ = vmovlps_avx(auVar8._0_16_);
  auVar13 = (undefined1  [56])0x0;
  VVar21 = AnimatedTransform::operator()((AnimatedTransform *)this,(Vector3f *)&local_f8,ref->time);
  local_168.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar13;
  local_168._0_8_ = vmovlps_avx(auVar9._0_16_);
  auVar13 = (undefined1  [56])0x0;
  local_180.bits =
       (this->super_ProjectiveCamera).super_CameraBase.medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       .bits;
  Interaction::Interaction
            (&local_148,(Point3f *)&local_158,(Normal3f *)&local_168,ref->time,
             (MediumHandle *)&local_180);
  PVar20 = Interaction::p(&local_148);
  auVar10._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar13;
  PVar22 = Interaction::p(ref);
  auVar11._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar13;
  local_1a0.super_Tuple3<pbrt::Vector3,_float>.z =
       PVar20.super_Tuple3<pbrt::Point3,_float>.z - PVar22.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7 = vsubps_avx(auVar10._0_16_,auVar11._0_16_);
  auVar17._0_4_ = auVar7._0_4_ * auVar7._0_4_;
  auVar17._4_4_ = auVar7._4_4_ * auVar7._4_4_;
  auVar17._8_4_ = auVar7._8_4_ * auVar7._8_4_;
  auVar17._12_4_ = auVar7._12_4_ * auVar7._12_4_;
  auVar6 = vmovshdup_avx(auVar17);
  auVar6 = vfmadd231ss_fma(auVar6,auVar7,auVar7);
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)local_1a0.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)local_1a0.super_Tuple3<pbrt::Vector3,_float>.z));
  auVar6 = vsqrtss_avx(auVar6,auVar6);
  fVar19 = auVar6._0_4_;
  auVar18._4_4_ = fVar19;
  auVar18._0_4_ = fVar19;
  auVar18._8_4_ = fVar19;
  auVar18._12_4_ = fVar19;
  auVar6 = vdivps_avx(auVar7,auVar18);
  local_1a0.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar6);
  local_1a0.super_Tuple3<pbrt::Vector3,_float>.z =
       local_1a0.super_Tuple3<pbrt::Vector3,_float>.z / fVar19;
  fVar1 = (this->super_ProjectiveCamera).lensRadius;
  tVar4 = AbsDot<float>(&local_148.n,&local_1a0);
  local_1a8.x = 0.0;
  local_1a8.y = 0.0;
  auVar7._0_8_ = local_1a0.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
  auVar7._8_4_ = 0x80000000;
  auVar7._12_4_ = 0x80000000;
  auVar13 = ZEXT856(auVar7._8_8_);
  auVar14._0_4_ = -local_1a0.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._4_4_ = 0x80000000;
  auVar14._8_4_ = 0x80000000;
  auVar14._12_4_ = 0x80000000;
  auVar16 = ZEXT856(auVar14._8_8_);
  local_178._0_8_ = vmovlps_avx(auVar7);
  local_178.z = auVar14._0_4_;
  Interaction::SpawnRay((RayDifferential *)&local_f8,&local_148,(Vector3f *)&local_178);
  SVar23 = We(this,(Ray *)&local_f8,lambda_00,(Point2f *)&local_1a8);
  auVar15._0_8_ = SVar23.values.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar12._0_8_ = SVar23.values.values._0_8_;
  auVar12._8_56_ = auVar13;
  local_190.values.values = (array<float,_4>)vmovlhps_avx(auVar12._0_16_,auVar15._0_16_);
  bVar3 = SampledSpectrum::operator_cast_to_bool(&local_190);
  SVar23.values.values = local_190.values.values;
  if (bVar3) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT816(0) << 0x40,4);
    bVar3 = (bool)((byte)uVar2 & 1);
    local_f8.Wi.values.values[0] = local_190.values.values[0];
    local_f8.Wi.values.values[1] = local_190.values.values[1];
    local_f8.Wi.values.values[2] = local_190.values.values[2];
    local_f8.Wi.values.values[3] = local_190.values.values[3];
    local_f8.wi.super_Tuple3<pbrt::Vector3,_float>.z =
         local_1a0.super_Tuple3<pbrt::Vector3,_float>.z;
    local_f8.wi.super_Tuple3<pbrt::Vector3,_float>.x =
         local_1a0.super_Tuple3<pbrt::Vector3,_float>.x;
    local_f8.wi.super_Tuple3<pbrt::Vector3,_float>.y =
         local_1a0.super_Tuple3<pbrt::Vector3,_float>.y;
    local_f8.pdf = (fVar19 * fVar19) /
                   ((float)((uint)bVar3 * (int)(fVar1 * fVar1 * 3.1415927) +
                           (uint)!bVar3 * 0x3f800000) * tVar4);
    local_f8.pRaster.super_Tuple2<pbrt::Point2,_float> = local_1a8;
    local_f8.pRef.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
         (ref->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
    local_f8.pRef.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y =
         (ref->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
    local_f8.pRef.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
         (ref->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    local_f8.pRef.time = ref->time;
    local_f8.pRef.wo.super_Tuple3<pbrt::Vector3,_float>.x =
         (ref->wo).super_Tuple3<pbrt::Vector3,_float>.x;
    local_f8.pRef.wo.super_Tuple3<pbrt::Vector3,_float>.y =
         (ref->wo).super_Tuple3<pbrt::Vector3,_float>.y;
    local_f8.pRef.wo.super_Tuple3<pbrt::Vector3,_float>.z =
         (ref->wo).super_Tuple3<pbrt::Vector3,_float>.z;
    local_f8.pRef.n.super_Tuple3<pbrt::Normal3,_float>.x =
         (ref->n).super_Tuple3<pbrt::Normal3,_float>.x;
    local_f8.pRef.n.super_Tuple3<pbrt::Normal3,_float>.y =
         (ref->n).super_Tuple3<pbrt::Normal3,_float>.y;
    local_f8.pRef._48_8_ = *(undefined8 *)&(ref->n).super_Tuple3<pbrt::Normal3,_float>.z;
    local_f8.pRef._56_8_ = *(undefined8 *)&(ref->uv).super_Tuple2<pbrt::Point2,_float>.y;
    local_f8.pRef.mediumInterface = ref->mediumInterface;
    local_f8.pRef.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )(ref->medium).
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
    local_f8.pLens.mediumInterface = local_148.mediumInterface;
    local_f8.pLens.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
         local_148.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
    local_f8.pLens.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y =
         local_148.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
    local_f8.pLens.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
         local_148.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    local_f8.pLens.time = local_148.time;
    local_f8.pLens.wo.super_Tuple3<pbrt::Vector3,_float>.x =
         local_148.wo.super_Tuple3<pbrt::Vector3,_float>.x;
    local_f8.pLens.wo.super_Tuple3<pbrt::Vector3,_float>.y =
         local_148.wo.super_Tuple3<pbrt::Vector3,_float>.y;
    local_f8.pLens.wo.super_Tuple3<pbrt::Vector3,_float>.z =
         local_148.wo.super_Tuple3<pbrt::Vector3,_float>.z;
    local_f8.pLens.n.super_Tuple3<pbrt::Normal3,_float>.x =
         local_148.n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_f8.pLens.n.super_Tuple3<pbrt::Normal3,_float>.y =
         local_148.n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_f8.pLens.n.super_Tuple3<pbrt::Normal3,_float>.z =
         local_148.n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_f8.pLens.uv.super_Tuple2<pbrt::Point2,_float>.x =
         local_148.uv.super_Tuple2<pbrt::Point2,_float>.x;
    local_f8.pLens.uv.super_Tuple2<pbrt::Point2,_float>.y =
         local_148.uv.super_Tuple2<pbrt::Point2,_float>.y;
    local_f8.pLens._60_4_ = local_148._60_4_;
    local_f8.pLens.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = local_148.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    local_190.values.values = SVar23.values.values;
    pstd::optional<pbrt::CameraWiSample>::optional(__return_storage_ptr__,&local_f8);
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraWiSample> PerspectiveCamera::SampleWi(
    const Interaction &ref, const Point2f &u, SampledWavelengths &lambda) const {
    // Uniformly sample a lens interaction _lensIntr_
    Point2f pLens = lensRadius * SampleUniformDiskConcentric(u);
    Point3f pLensRender = RenderFromCamera(Point3f(pLens.x, pLens.y, 0), ref.time);
    Normal3f n = Normal3f(RenderFromCamera(Vector3f(0, 0, 1), ref.time));
    Interaction lensIntr(pLensRender, n, ref.time, medium);

    // Populate arguments and compute the importance value
    // Compute incident direction to camera _wi_ at _ref_
    Vector3f wi = lensIntr.p() - ref.p();
    Float dist = Length(wi);
    wi /= dist;

    // Compute PDF for importance arriving at _ref_
    Float lensArea = lensRadius != 0 ? (Pi * lensRadius * lensRadius) : 1;
    Float pdf = (dist * dist) / (AbsDot(lensIntr.n, wi) * lensArea);

    Point2f pRaster;
    SampledSpectrum Wi = We(lensIntr.SpawnRay(-wi), lambda, &pRaster);
    if (!Wi)
        return {};
    return CameraWiSample(Wi, wi, pdf, pRaster, ref, lensIntr);
}